

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

size_t __thiscall
llama_context::state_seq_load_file
          (llama_context *this,llama_seq_id seq_id,char *filepath,llama_token *tokens_out,
          size_t n_token_capacity,size_t *n_token_count_out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  size_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  llama_file file;
  llama_io_read_file io;
  llama_file local_70;
  size_t local_68;
  llama_io_read_i local_60;
  llama_file *local_58;
  undefined8 local_50;
  void *pvStack_48;
  undefined8 local_40;
  long lStack_38;
  ulong uVar5;
  
  llama_file::llama_file(&local_70,filepath,"rb");
  uVar1 = llama_file::read_u32(&local_70);
  uVar2 = llama_file::read_u32(&local_70);
  if (uVar2 == 2 && uVar1 == 0x67677371) {
    uVar1 = llama_file::read_u32(&local_70);
    uVar5 = (ulong)uVar1;
    if (n_token_capacity < uVar5) {
      sVar4 = 0;
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: token count in sequence state file exceeded capacity! %u > %zu\n",
                         "state_seq_load_file",(ulong)uVar1,n_token_capacity);
    }
    else {
      llama_file::read_raw(&local_70,tokens_out,uVar5 * 4);
      *n_token_count_out = uVar5;
      sVar4 = llama_file::size(&local_70);
      local_68 = llama_file::tell(&local_70);
      local_60._vptr_llama_io_read_i = (_func_int **)&PTR__llama_io_read_file_002856c0;
      local_50 = 0;
      pvStack_48 = (void *)0x0;
      local_40 = 0;
      lStack_38 = 0;
      local_58 = &local_70;
      llama_kv_cache_unified::state_read
                ((this->kv_self)._M_t.
                 super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                 .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,&local_60,
                 seq_id);
      iVar3 = (*local_60._vptr_llama_io_read_i[4])();
      uVar5 = CONCAT44(extraout_var,iVar3);
      if (uVar5 == 0) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to restore sequence state\n",
                           "state_seq_load_file");
      }
      else {
        if (sVar4 - local_68 < uVar5) {
          pcVar7 = "nread <= state_size";
          uVar8 = 0x7c9;
LAB_00192132:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,uVar8,"GGML_ASSERT(%s) failed",pcVar7);
        }
        sVar4 = *n_token_count_out;
        sVar6 = llama_file::tell(&local_70);
        if (uVar5 + sVar4 * 4 + 0xc != sVar6) {
          pcVar7 = 
          "nread + sizeof(uint32_t) * 3 + sizeof(llama_token) * *n_token_count_out == file.tell()";
          uVar8 = 0x7ca;
          goto LAB_00192132;
        }
      }
      local_60._vptr_llama_io_read_i = (_func_int **)&PTR__llama_io_read_file_002856c0;
      if (pvStack_48 != (void *)0x0) {
        operator_delete(pvStack_48,lStack_38 - (long)pvStack_48);
      }
      if (uVar5 == 0) {
        sVar4 = 0;
      }
      else {
        sVar4 = llama_file::tell(&local_70);
      }
    }
  }
  else {
    sVar4 = 0;
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: unknown (magic, version) for sequence state file: %08x, %08x\n",
                       "state_seq_load_file",(ulong)uVar1,(ulong)uVar2);
  }
  llama_file::~llama_file(&local_70);
  return sVar4;
}

Assistant:

size_t llama_context::state_seq_load_file(llama_seq_id seq_id, const char * filepath, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    llama_file file(filepath, "rb");

    // version checks
    {
        const uint32_t magic   = file.read_u32();
        const uint32_t version = file.read_u32();

        if (magic != LLAMA_STATE_SEQ_MAGIC || version != LLAMA_STATE_SEQ_VERSION) {
            LLAMA_LOG_ERROR("%s: unknown (magic, version) for sequence state file: %08x, %08x\n", __func__, magic, version);
            return 0;
        }
    }

    // load the prompt
    {
        const uint32_t n_token_count = file.read_u32();

        if (n_token_count > n_token_capacity) {
            LLAMA_LOG_ERROR("%s: token count in sequence state file exceeded capacity! %u > %zu\n", __func__, n_token_count, n_token_capacity);
            return 0;
        }

        file.read_raw(tokens_out, sizeof(llama_token) * n_token_count);
        *n_token_count_out = n_token_count;
    }

    // restore the context state
    {
        const size_t state_size = file.size() - file.tell();
        llama_io_read_file io(&file);
        const size_t nread = state_seq_read_data(io, seq_id);
        if (!nread) {
            LLAMA_LOG_ERROR("%s: failed to restore sequence state\n", __func__);
            return 0;
        }
        GGML_ASSERT(nread <= state_size);
        GGML_ASSERT(nread + sizeof(uint32_t) * 3 + sizeof(llama_token) * *n_token_count_out == file.tell());
    }

    return file.tell();
}